

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O3

PDFObject * __thiscall PDFObjectParser::ParseNumber(PDFObjectParser *this,string *inToken)

{
  long lVar1;
  PDFReal *this_00;
  Trace *this_01;
  STDStreamsReader<double> reader;
  STDStreamsReader<double> local_19;
  double local_18;
  
  lVar1 = std::__cxx11::string::find((char)inToken,0x2e);
  if (lVar1 == -1) {
    STDStreamsReader<long_long>::Read
              ((STDStreamsReader<long_long> *)&local_19,inToken,(longlong *)&local_18);
    if ((double)(long)SUB84(local_18,0) == local_18) {
      this_00 = (PDFReal *)operator_new(0x50);
      PDFInteger::PDFInteger((PDFInteger *)this_00,(longlong)local_18);
    }
    else {
      this_01 = Trace::DefaultTrace();
      this_00 = (PDFReal *)0x0;
      Trace::TraceToLog(this_01,
                        "PDFObjectParser::ParseNumber, parsed integer %lld is outside of the allowed range for PDF integers - %ld to %ld"
                        ,local_18,0xffffffff80000000,0x7fffffff);
    }
  }
  else {
    this_00 = (PDFReal *)operator_new(0x50);
    STDStreamsReader<double>::Read(&local_19,inToken,&local_18);
    PDFReal::PDFReal(this_00,local_18);
  }
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseNumber(const std::string& inToken)
{
	// once we know this is a number, then parsing is easy. just determine if it's a real or integer, so as to separate classes for better accuracy
	if(inToken.find(scDot) != inToken.npos) {
		return new PDFReal(Double(inToken));
	} else {
		long long integerValue = LongLong(inToken);

		// validate int value according to PDF limits. ignore if outside of range
		if((integerValue > MAX_PDF_INT) || (integerValue < MIN_PDF_INT)) {
			TRACE_LOG3("PDFObjectParser::ParseNumber, parsed integer %lld is outside of the allowed range for PDF integers - %ld to %ld", integerValue, MIN_PDF_INT, MAX_PDF_INT);
			return NULL;
		}

		return new PDFInteger(integerValue);
	}
}